

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

SpecparamDeclarationSyntax * __thiscall
slang::parsing::Parser::parseSpecparam(Parser *this,AttrList attr,SyntaxKind parentKind)

{
  bool bVar1;
  undefined4 extraout_var;
  ImplicitTypeSyntax *type;
  SourceLocation location;
  SpecparamDeclaratorSyntax *pSVar2;
  SpecparamDeclarationSyntax *pSVar3;
  EVP_PKEY_CTX *src;
  Info *pIVar4;
  Info *extraout_RDX;
  Info *pIVar5;
  TokenKind kind;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *attributes;
  TokenKind TVar6;
  ulong uVar7;
  Token keyword;
  Token TVar8;
  Token TVar9;
  Token semi;
  VariableDimensionSyntax *dim;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_168;
  ulong local_158;
  undefined8 uStack_150;
  size_t local_148;
  pointer local_140;
  size_t local_138;
  Token local_130;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> buffer;
  SmallVector<slang::syntax::VariableDimensionSyntax_*,_5UL> dims;
  Token current;
  
  keyword = ParserBase::consume(&this->super_ParserBase);
  dim = parseDimension(this);
  dims.super_SmallVectorBase<slang::syntax::VariableDimensionSyntax_*>.data_ =
       (pointer)dims.super_SmallVectorBase<slang::syntax::VariableDimensionSyntax_*>.firstElement;
  dims.super_SmallVectorBase<slang::syntax::VariableDimensionSyntax_*>.len = 0;
  dims.super_SmallVectorBase<slang::syntax::VariableDimensionSyntax_*>.cap = 5;
  if (dim != (VariableDimensionSyntax *)0x0) {
    SmallVectorBase<slang::syntax::VariableDimensionSyntax*>::
    emplace_back<slang::syntax::VariableDimensionSyntax*const&>
              ((SmallVectorBase<slang::syntax::VariableDimensionSyntax*> *)&dims,&dim);
  }
  Token::Token(&local_130);
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement._16_4_ =
       SmallVectorBase<slang::syntax::VariableDimensionSyntax_*>::copy
                 (&dims.super_SmallVectorBase<slang::syntax::VariableDimensionSyntax_*>,
                  (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement._20_4_ = extraout_var;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len =
       CONCAT44(buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len._4_4_,1);
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 0;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[1] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[2] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[3] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[4] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[5] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[6] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[7] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ = (pointer)&PTR_getChild_002da900
  ;
  TVar8 = ParserBase::placeholderToken(&this->super_ParserBase);
  type = syntax::SyntaxFactory::implicitType
                   (&this->factory,local_130,
                    (SyntaxList<slang::syntax::VariableDimensionSyntax> *)&buffer,TVar8);
  Token::Token(&semi);
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
       (pointer)buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 4;
  TVar8 = ParserBase::peek(&this->super_ParserBase);
  current = TVar8;
  bVar1 = syntax::SyntaxFacts::isNotIdOrComma(TVar8.kind);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      location = Token::location(&current);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x380005,location);
    }
  }
  else {
    bVar1 = syntax::SyntaxFacts::isIdentifierOrComma(TVar8.kind);
    if (!bVar1) {
      ParserBase::reportMissingList
                (&this->super_ParserBase,TVar8,Semicolon,&semi,(DiagCode)0x380005);
      pIVar5 = extraout_RDX;
      goto LAB_001bf7c2;
    }
    do {
      do {
        pIVar5 = TVar8.info;
        pSVar2 = parseSpecparamDeclarator(this,parentKind);
        local_168._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pSVar2;
        local_158 = CONCAT71(local_158._1_7_,1);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                   (TokenOrSyntax *)&local_168._M_first);
        TVar9 = ParserBase::peek(&this->super_ParserBase);
        bVar1 = syntax::SyntaxFacts::isNotIdOrComma(TVar9.kind);
        if (TVar9.kind != Comma || bVar1) goto LAB_001bf7ad;
        local_168._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        local_158 = local_158 & 0xffffffffffffff00;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                   (TokenOrSyntax *)&local_168._M_first);
        TVar9 = ParserBase::peek(&this->super_ParserBase);
        pIVar4 = TVar9.info;
        kind = TVar9.kind;
        bVar1 = syntax::SyntaxFacts::isNotIdOrComma(kind);
        if (kind == EndOfFile || bVar1) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          goto LAB_001bf7ad;
        }
        TVar6 = TVar8.kind;
        uVar7 = TVar9._0_8_ & 0xffffffff;
        TVar8.info = pIVar4;
        TVar8.kind = (short)uVar7;
        TVar8._2_1_ = (char)(uVar7 >> 0x10);
        TVar8.numFlags.raw = (char)(uVar7 >> 0x18);
        TVar8.rawLen = (int)(uVar7 >> 0x20);
      } while (pIVar5 != pIVar4 || TVar6 != kind);
      bVar1 = ParserBase::
              skipBadTokens<&slang::syntax::SyntaxFacts::isIdentifierOrComma,&slang::syntax::SyntaxFacts::isNotIdOrComma>
                        (&this->super_ParserBase,(DiagCode)0x380005,true);
      uVar7 = TVar9._0_8_ & 0xffffffff;
      TVar8.kind = (short)uVar7;
      TVar8._2_1_ = (char)(uVar7 >> 0x10);
      TVar8.numFlags.raw = (char)(uVar7 >> 0x18);
      TVar8.rawLen = (int)(uVar7 >> 0x20);
    } while (bVar1);
  }
LAB_001bf7ad:
  semi = ParserBase::expect(&this->super_ParserBase,Semicolon);
  pIVar5 = semi.info;
LAB_001bf7c2:
  local_168._8_4_ = 1;
  local_158 = 0;
  uStack_150 = 0;
  local_168._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_002da628;
  local_148 = attr._M_extent._M_extent_value._M_extent_value;
  local_140 = attr._M_ptr;
  local_138 = attr._M_extent._M_extent_value._M_extent_value;
  SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
            (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
             (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)pIVar5);
  current.info._0_4_ = 3;
  current._0_8_ = &PTR_getChild_002dbc08;
  attributes = &local_168;
  pSVar3 = syntax::SyntaxFactory::specparamDeclaration
                     (&this->factory,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&attributes->_M_first,
                      keyword,type,
                      (SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax> *)&current,semi
                     );
  SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
            (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
             (EVP_PKEY_CTX *)&attributes->_M_first);
  SmallVectorBase<slang::syntax::VariableDimensionSyntax_*>::cleanup
            (&dims.super_SmallVectorBase<slang::syntax::VariableDimensionSyntax_*>,
             (EVP_PKEY_CTX *)&attributes->_M_first);
  return pSVar3;
}

Assistant:

SpecparamDeclarationSyntax& Parser::parseSpecparam(AttrList attr, SyntaxKind parentKind) {
    auto keyword = consume();

    auto dim = parseDimension();
    SmallVector<VariableDimensionSyntax*> dims;
    if (dim)
        dims.push_back(dim);

    auto& type = factory.implicitType(Token(), dims.copy(alloc), placeholderToken());

    Token semi;
    SmallVector<TokenOrSyntax, 4> buffer;
    parseList<isIdentifierOrComma, isNotIdOrComma>(buffer, TokenKind::Semicolon, TokenKind::Comma,
                                                   semi, RequireItems::True,
                                                   diag::ExpectedDeclarator, [this, parentKind] {
                                                       return &parseSpecparamDeclarator(parentKind);
                                                   });

    return factory.specparamDeclaration(attr, keyword, type, buffer.copy(alloc), semi);
}